

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_Tt8IsopCover(word *uOn,word *uOnDc,int nVars,word *uRes,int *pCover,int *pnCubes)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  long lVar5;
  int *pnCubes_00;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  word uRes2 [2];
  word uRes1 [2];
  word uRes0 [2];
  word uOnDc2 [2];
  word uOn1 [2];
  word uOn0 [2];
  ulong local_a8;
  ulong uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  ulong local_48;
  ulong local_40;
  
  if (nVars < 7) {
    wVar4 = Abc_Tt6IsopCover(*uOn,*uOnDc,nVars,pCover,pnCubes);
    uRes[3] = wVar4;
    uRes[2] = wVar4;
    uRes[1] = wVar4;
    *uRes = wVar4;
  }
  else {
    if (nVars != 7) {
      if ((((*uOn != uOn[2]) || (uOn[1] != uOn[3])) || (*uOnDc != uOnDc[2])) ||
         (uOnDc[1] != uOnDc[3])) {
        if (nVars != 8) {
          __assert_fail("nVars == 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x7d9,"void Abc_Tt8IsopCover(word *, word *, int, word *, int *, int *)");
        }
        local_48 = *uOn & ~uOnDc[2];
        local_40 = ~uOnDc[3] & uOn[1];
        local_78 = uOnDc[2] & *uOnDc;
        local_68 = uOn[2] & ~*uOnDc;
        local_60 = ~uOnDc[1] & uOn[3];
        local_70 = uOnDc[1] & uOnDc[3];
        iVar2 = *pnCubes;
        pnCubes_00 = pnCubes;
        Abc_Tt7IsopCover(&local_48,uOnDc,(int)&local_88,(word *)pCover,pnCubes,pnCubes);
        lVar6 = (long)*pnCubes;
        Abc_Tt7IsopCover(&local_68,uOnDc + 2,(int)&local_98,(word *)pCover,pnCubes,pnCubes_00);
        iVar3 = *pnCubes;
        local_58 = ~local_98 & (uint)uOn[2] | ~local_88 & (uint)*uOn;
        uStack_54 = ~uStack_94 & *(uint *)((long)uOn + 0x14) | ~uStack_84 & *(uint *)((long)uOn + 4)
        ;
        uStack_50 = ~uStack_90 & (uint)uOn[3] | ~uStack_80 & (uint)uOn[1];
        uStack_4c = ~uStack_8c & *(uint *)((long)uOn + 0x1c) |
                    ~uStack_7c & *(uint *)((long)uOn + 0xc);
        Abc_Tt7IsopCover((word *)&local_58,&local_78,(int)&local_a8,(word *)pCover,pnCubes,
                         pnCubes_00);
        uVar7 = CONCAT44(uStack_84,local_88) | local_a8;
        uVar8 = CONCAT44(uStack_7c,uStack_80) | uStack_a0;
        local_a8 = local_a8 | CONCAT44(uStack_94,local_98);
        uStack_a0 = uStack_a0 | CONCAT44(uStack_8c,uStack_90);
        uRes[2] = local_a8;
        uRes[3] = uStack_a0;
        *uRes = uVar7;
        uRes[1] = uVar8;
        for (lVar5 = (long)iVar2; lVar5 < lVar6; lVar5 = lVar5 + 1) {
          pbVar1 = (byte *)((long)pCover + lVar5 * 4 + 1);
          *pbVar1 = *pbVar1 | 0x40;
        }
        for (; lVar6 < iVar3; lVar6 = lVar6 + 1) {
          pbVar1 = (byte *)((long)pCover + lVar6 * 4 + 1);
          *pbVar1 = *pbVar1 | 0x80;
        }
        if ((((*uOn & ~uVar7) == 0) && ((uOn[1] & ~uVar8) == 0)) &&
           (((uOn[2] & ~local_a8) == 0 && ((uOn[3] & ~uStack_a0) == 0)))) {
          if ((((uVar7 & ~*uOnDc) == 0) && ((uVar8 & ~uOnDc[1]) == 0)) &&
             (((local_a8 & ~uOnDc[2]) == 0 && ((uStack_a0 & ~uOnDc[3]) == 0)))) {
            return;
          }
          __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x7f4,"void Abc_Tt8IsopCover(word *, word *, int, word *, int *, int *)");
        }
        __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x7f3,"void Abc_Tt8IsopCover(word *, word *, int, word *, int *, int *)");
      }
    }
    Abc_Tt7IsopCover(uOn,uOnDc,(int)uRes,(word *)pCover,pnCubes,pnCubes);
    uRes[2] = *uRes;
    uRes[3] = uRes[1];
  }
  return;
}

Assistant:

static inline void Abc_Tt8IsopCover( word uOn[4], word uOnDc[4], int nVars, word uRes[4], int * pCover, int * pnCubes )
{
    if ( nVars <= 6 )
        uRes[0] = uRes[1] = uRes[2] = uRes[3] = Abc_Tt6IsopCover( uOn[0], uOnDc[0], nVars, pCover, pnCubes );
    else if ( nVars == 7 || (uOn[0] == uOn[2] && uOn[1] == uOn[3] && uOnDc[0] == uOnDc[2] && uOnDc[1] == uOnDc[3]) )
    {
        Abc_Tt7IsopCover( uOn, uOnDc, 7, uRes, pCover, pnCubes );
        uRes[2] = uRes[0];
        uRes[3] = uRes[1];
    }
    else 
    {
        word uOn0[2], uOn1[2], uOn2[2], uOnDc2[2], uRes0[2], uRes1[2], uRes2[2];
        int c, nBeg0, nEnd0, nEnd1;
        assert( nVars == 8 );
        // cofactor
        uOn0[0] = uOn[0] & ~uOnDc[2];
        uOn0[1] = uOn[1] & ~uOnDc[3];
        uOn1[0] = uOn[2] & ~uOnDc[0];
        uOn1[1] = uOn[3] & ~uOnDc[1];
        uOnDc2[0] = uOnDc[0] & uOnDc[2];
        uOnDc2[1] = uOnDc[1] & uOnDc[3];
        // solve for cofactors
        nBeg0 = *pnCubes; 
        Abc_Tt7IsopCover( uOn0, uOnDc+0, 7, uRes0, pCover, pnCubes );
        nEnd0 = *pnCubes;
        Abc_Tt7IsopCover( uOn1, uOnDc+2, 7, uRes1, pCover, pnCubes );
        nEnd1 = *pnCubes;
        uOn2[0] = (uOn[0] & ~uRes0[0]) | (uOn[2] & ~uRes1[0]);
        uOn2[1] = (uOn[1] & ~uRes0[1]) | (uOn[3] & ~uRes1[1]);
        Abc_Tt7IsopCover( uOn2, uOnDc2, 7, uRes2, pCover, pnCubes );
        // derive the final truth table
        uRes[0] = uRes2[0] | uRes0[0];
        uRes[1] = uRes2[1] | uRes0[1];
        uRes[2] = uRes2[0] | uRes1[0];
        uRes[3] = uRes2[1] | uRes1[1];
        for ( c = nBeg0; c < nEnd0; c++ )
            pCover[c] |= (1 << (2*7+0));
        for ( c = nEnd0; c < nEnd1; c++ )
            pCover[c] |= (1 << (2*7+1));
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0 );
    }
}